

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub_test.c
# Opt level: O0

void test_sub_identity(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  char *n;
  uint16_t p;
  nng_socket s;
  
  nVar1 = nng_sub0_open((nng_socket *)((long)&n + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x14,"%s: expected success, got %s (%d)","nng_sub0_open(&s)",pcVar3,nVar1)
  ;
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_proto_id(n._4_4_,(uint16_t *)((long)&n + 2));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x15,"%s: expected success, got %s (%d)","nng_socket_proto_id(s, &p)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(n._2_2_ == 0x21),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                 ,0x16,"%s","p == NUTS_PROTO(2u, 1u)");
  nVar1 = nng_socket_peer_id(n._4_4_,(uint16_t *)((long)&n + 2));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x17,"%s: expected success, got %s (%d)","nng_socket_peer_id(s, &p)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(n._2_2_ == 0x20),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                 ,0x18,"%s","p == NUTS_PROTO(2u, 0u)");
  nVar1 = nng_socket_proto_name(n._4_4_,(char **)&result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x19,"%s: expected success, got %s (%d)","nng_socket_proto_name(s, &n)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  iVar2 = strcmp(_result__1,"sub");
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                 ,0x1a,"%s == %s",_result__1,"sub",nVar1);
  nVar1 = nng_socket_peer_name(n._4_4_,(char **)&result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x1b,"%s: expected success, got %s (%d)","nng_socket_peer_name(s, &n)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  iVar2 = strcmp(_result__1,"pub");
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                 ,0x1c,"%s == %s",_result__1,"pub",nVar1);
  nVar1 = nng_socket_close(n._4_4_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pubsub0/sub_test.c"
                         ,0x1d,"%s: expected success, got %s (%d)","nng_socket_close(s)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  return;
}

Assistant:

static void
test_sub_identity(void)
{
	nng_socket  s;
	uint16_t    p;
	const char *n;

	NUTS_PASS(nng_sub0_open(&s));
	NUTS_PASS(nng_socket_proto_id(s, &p));
	NUTS_TRUE(p == NUTS_PROTO(2u, 1u)); // 33
	NUTS_PASS(nng_socket_peer_id(s, &p));
	NUTS_TRUE(p == NUTS_PROTO(2u, 0u)); // 32
	NUTS_PASS(nng_socket_proto_name(s, &n));
	NUTS_MATCH(n, "sub");
	NUTS_PASS(nng_socket_peer_name(s, &n));
	NUTS_MATCH(n, "pub");
	NUTS_CLOSE(s);
}